

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O2

void __thiscall duckdb::AttachedDatabase::~AttachedDatabase(AttachedDatabase *this)

{
  (this->super_CatalogEntry)._vptr_CatalogEntry = (_func_int **)&PTR__AttachedDatabase_027981c8;
  Close(this);
  ::std::unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>::
  ~unique_ptr(&(this->transaction_manager).
               super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
             );
  ::std::unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>::~unique_ptr
            (&(this->catalog).
              super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>);
  ::std::unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>::
  ~unique_ptr(&(this->storage).
               super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
             );
  InCatalogEntry::~InCatalogEntry((InCatalogEntry *)this);
  return;
}

Assistant:

AttachedDatabase::~AttachedDatabase() {
	Close();
}